

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track-heuristic-partition-matching.cxx
# Opt level: O3

int main(int argc,char **argv)

{
  pointer puVar1;
  pointer puVar2;
  pointer pEVar3;
  runtime_error *this;
  Edge *e;
  pointer pEVar4;
  size_t in_R9;
  double dVar5;
  double dVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Problem problem;
  Parameters parameters;
  SolutionGraph solutionGraph;
  ProblemGraph problemGraph;
  double local_270;
  Solution local_268;
  string local_250;
  double local_230;
  long *local_228 [2];
  long local_218 [2];
  Problem local_208;
  Parameters local_1b8;
  SolutionGraph local_128;
  ProblemGraph local_a8;
  
  parseCommandLine(&local_1b8,argc,argv);
  local_208.node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.nodes.super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.nodes.super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.nodes.super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lineage::loadNodes(&local_1b8.nodesFileName,&local_208);
  lineage::loadEdges(&local_1b8.edgesFileName,&local_208);
  pEVar3 = local_208.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pEVar4 = local_208.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>.
                _M_impl.super__Vector_impl_data._M_start; pEVar4 != pEVar3; pEVar4 = pEVar4 + 1) {
    dVar5 = pEVar4->weight;
    if (pEVar4->t0 == pEVar4->t1) {
      dVar6 = 0.00392156862745098;
      if ((0.00392156862745098 <= dVar5) && (dVar6 = dVar5, 0.996078431372549 < dVar5)) {
        dVar6 = 0.996078431372549;
      }
      local_270 = log((1.0 - dVar6) / dVar6);
      dVar5 = local_1b8.biasSpatial;
    }
    else {
      dVar6 = 0.00392156862745098;
      if ((0.00392156862745098 <= dVar5) && (dVar6 = dVar5, 0.996078431372549 < dVar5)) {
        dVar6 = 0.996078431372549;
      }
      local_270 = log((1.0 - dVar6) / dVar6);
      dVar5 = local_1b8.biasTemporal;
    }
    dVar6 = 0.00392156862745098;
    if ((dVar5 < 0.00392156862745098) || (dVar6 = 0.996078431372549, 0.996078431372549 < dVar5)) {
      dVar5 = dVar6;
    }
    dVar5 = log((1.0 - dVar5) / dVar5);
    pEVar4->weight = dVar5 + local_270;
  }
  local_268.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1b8.bifurcationConstraint != false) {
    lineage::ProblemGraph::ProblemGraph(&local_a8,&local_208);
    local_230 = local_1b8.birthCost;
    local_228[0] = local_218;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_228,local_1b8.solutionName._M_dataplus._M_p,
               local_1b8.solutionName._M_dataplus._M_p + local_1b8.solutionName._M_string_length);
    lineage::heuristics::
    applyInitializedHeuristic<lineage::heuristics::LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>>,lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,std::allocator<double>>>>
              ((Solution *)&local_128,(heuristics *)&local_a8,
               (ProblemGraph *)(ulong)local_1b8.bifurcationConstraint,local_1b8.terminationCost,
               local_230,SUB81(local_228,0),(string *)local_1b8.maxDistance,in_R9);
    puVar2 = local_268.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar1 = local_268.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_268.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_128.problemGraph_;
    local_268.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_128.solution_;
    local_268.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_128.cellOfNode_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_128.problemGraph_ = (ProblemGraph *)0x0;
    local_128.solution_ = (Solution *)0x0;
    local_128.cellOfNode_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if ((puVar1 != (pointer)0x0) &&
       (operator_delete(puVar1,(long)puVar2 - (long)puVar1),
       local_128.problemGraph_ != (ProblemGraph *)0x0)) {
      operator_delete(local_128.problemGraph_,
                      (long)local_128.cellOfNode_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start - (long)local_128.problemGraph_
                     );
    }
    if (local_228[0] != local_218) {
      operator_delete(local_228[0],local_218[0] + 1);
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_a8.nodeIndicesInFrame_);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_a8.edgeIndicesInFrame_);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_a8.edgeIndicesFromFrame_);
    if (local_a8.graph_.edges_.
        super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.graph_.edges_.
                      super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.graph_.edges_.
                            super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.graph_.edges_.
                            super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
    ::~vector(&local_a8.graph_.vertices_);
    lineage::ProblemGraph::ProblemGraph(&local_a8,&local_208);
    lineage::SolutionGraph::SolutionGraph(&local_128,&local_a8,&local_268);
    lineage::SolutionGraph::save(&local_128,&local_1b8.solutionName);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_250,local_1b8.solutionName._M_dataplus._M_p,
               local_1b8.solutionName._M_dataplus._M_p + local_1b8.solutionName._M_string_length);
    std::__cxx11::string::append((char *)&local_250);
    lineage::SolutionGraph::saveSVG(&local_128,&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_128.nodesOfCell_);
    if (local_128.lineageGraph_.edges_.
        super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.lineageGraph_.edges_.
                      super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_128.lineageGraph_.edges_.
                            super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.lineageGraph_.edges_.
                            super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
    ::~vector(&local_128.lineageGraph_.vertices_);
    if (local_128.cellOfNode_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.cellOfNode_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.cellOfNode_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.cellOfNode_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_a8.nodeIndicesInFrame_);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_a8.edgeIndicesInFrame_);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~vector(&local_a8.edgeIndicesFromFrame_);
    if (local_a8.graph_.edges_.
        super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.graph_.edges_.
                      super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.graph_.edges_.
                            super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.graph_.edges_.
                            super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
    ::~vector(&local_a8.graph_.vertices_);
    if ((ProblemGraph *)
        local_268.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (ProblemGraph *)0x0) {
      operator_delete(local_268.edge_labels.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_268.edge_labels.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_268.edge_labels.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_208.node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.node_offsets.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.node_offsets.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.node_offsets.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_208.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.edges.
                      super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.edges.
                            super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.edges.
                            super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_208.nodes.super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.nodes.
                      super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.nodes.
                            super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.nodes.
                            super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.solutionName._M_dataplus._M_p != &local_1b8.solutionName.field_2) {
      operator_delete(local_1b8.solutionName._M_dataplus._M_p,
                      local_1b8.solutionName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.nodesFileName._M_dataplus._M_p != &local_1b8.nodesFileName.field_2) {
      operator_delete(local_1b8.nodesFileName._M_dataplus._M_p,
                      local_1b8.nodesFileName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8.edgesFileName._M_dataplus._M_p != &local_1b8.edgesFileName.field_2) {
      operator_delete(local_1b8.edgesFileName._M_dataplus._M_p,
                      local_1b8.edgesFileName.field_2._M_allocated_capacity + 1);
    }
    return 0;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Disabled bifurcation constraints are not supported.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int
main(int argc, char** argv) try {
    auto parameters = parseCommandLine(argc, argv);

    // load problem:
    auto problem = lineage::loadProblem(parameters.nodesFileName,
                                        parameters.edgesFileName);

    // map edge probabilities to edge cut costs:
    lineage::NegativeLogProbabilityRatio<> func;
    for (auto& e : problem.edges)
        if (e.t0 != e.t1)
            e.weight = func(e.weight) + func(parameters.biasTemporal);
        else
            e.weight = func(e.weight) + func(parameters.biasSpatial);

    // heuristic for initial lineage.
    using Initializer = lineage::heuristics::GreedyLineageAgglomeration<>;

    // global optimizer.
    using BranchingOpt = lineage::heuristics::branching::HungarianBranching<
        lineage::heuristics::PartitionGraph>;

    using LocalBranchingOpt =
        lineage::heuristics::branching::MaskedHungarianBranching<
            lineage::heuristics::PartitionGraph>;
    using HeuristicWithBifurcation =
        lineage::heuristics::LocalPartitionOptimizer<BranchingOpt,
                                                     LocalBranchingOpt>;

    // solve problem
    lineage::Solution solution;
    if (parameters.bifurcationConstraint) {
        solution = lineage::heuristics::applyInitializedHeuristic<
            HeuristicWithBifurcation, Initializer>(
            problem, parameters.terminationCost, parameters.birthCost,
            parameters.bifurcationConstraint, parameters.solutionName,
            parameters.maxDistance);
    } else {
        throw std::runtime_error(
            "Disabled bifurcation constraints are not supported.");
    }

    // save solution:
    lineage::ProblemGraph problemGraph(problem);
    lineage::SolutionGraph solutionGraph(problemGraph, solution);
    solutionGraph.save(parameters.solutionName);
    solutionGraph.saveSVG(parameters.solutionName + "-lineage-tree.svg");

    return 0;
} catch (const std::runtime_error& error) {
    std::cerr << "error: " << error.what() << std::endl;
    return 1;
}